

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O2

void GEN_CS::call_cs_ldf<true>
               (multi_learner *base,multi_ex *examples,v_array<CB::label> *cb_labels,
               label *cs_labels,v_array<COST_SENSITIVE::label> *prepped_cs_labels,uint64_t offset,
               size_t id)

{
  label_t *plVar1;
  undefined8 *puVar2;
  pointer ppeVar3;
  uint64_t uVar4;
  example *peVar5;
  label_t lVar6;
  label_t lVar7;
  size_t sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  iterator __begin2;
  pointer ppeVar14;
  multi_ex *__range2;
  long lVar15;
  
  v_array<CB::label>::clear(cb_labels);
  uVar13 = ((long)(cs_labels->costs)._end - (long)(cs_labels->costs)._begin >> 4) + 1;
  if ((ulong)((long)prepped_cs_labels->_end - (long)prepped_cs_labels->_begin >> 5) < uVar13) {
    v_array<COST_SENSITIVE::label>::resize(prepped_cs_labels,uVar13);
    prepped_cs_labels->_end = prepped_cs_labels->end_array;
  }
  ppeVar14 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar4 = ((*ppeVar14)->super_example_predict).ft_offset;
  lVar12 = 0;
  lVar15 = 0;
  for (; ppeVar14 != ppeVar3; ppeVar14 = ppeVar14 + 1) {
    peVar5 = *ppeVar14;
    v_array<CB::label>::push_back(cb_labels,&(peVar5->l).cb);
    v_array<COST_SENSITIVE::wclass>::clear
              ((v_array<COST_SENSITIVE::wclass> *)
               ((long)&(prepped_cs_labels->_begin->costs)._begin + lVar15));
    v_array<COST_SENSITIVE::wclass>::push_back
              ((v_array<COST_SENSITIVE::wclass> *)
               ((long)&(prepped_cs_labels->_begin->costs)._begin + lVar15),
               (wclass *)((long)&((cs_labels->costs)._begin)->x + lVar12));
    plVar1 = (label_t *)((long)&(prepped_cs_labels->_begin->costs)._begin + lVar15);
    lVar6 = *plVar1;
    lVar7 = plVar1[1];
    puVar2 = (undefined8 *)((long)&(prepped_cs_labels->_begin->costs).end_array + lVar15);
    sVar8 = puVar2[1];
    (peVar5->l).cs.costs.end_array = (wclass *)*puVar2;
    (peVar5->l).cs.costs.erase_count = sVar8;
    (peVar5->l).multi = lVar6;
    (peVar5->l).cs.costs._end = (wclass *)lVar7;
    (peVar5->super_example_predict).ft_offset = offset;
    lVar15 = lVar15 + 0x20;
    lVar12 = lVar12 + 0x10;
  }
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
            (base,examples,(long)(int)id);
  lVar12 = 0;
  for (uVar13 = 0;
      ppeVar14 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar14 >> 3);
      uVar13 = uVar13 + 1) {
    lVar15 = *(long *)((long)ppeVar14 + lVar12);
    puVar2 = (undefined8 *)((long)&(cb_labels->_begin->costs)._begin + lVar12 * 4);
    uVar9 = *puVar2;
    uVar10 = puVar2[1];
    puVar2 = (undefined8 *)((long)&(cb_labels->_begin->costs).end_array + lVar12 * 4);
    uVar11 = puVar2[1];
    *(undefined8 *)(lVar15 + 0x6838) = *puVar2;
    *(undefined8 *)(lVar15 + 0x6840) = uVar11;
    *(undefined8 *)(lVar15 + 0x6828) = uVar9;
    *(undefined8 *)(lVar15 + 0x6830) = uVar10;
    *(uint64_t *)
     (*(long *)((long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar12) + 0x6820) = uVar4;
    lVar12 = lVar12 + 8;
  }
  return;
}

Assistant:

void call_cs_ldf(LEARNER::multi_learner& base, multi_ex& examples, v_array<CB::label>& cb_labels,
    COST_SENSITIVE::label& cs_labels, v_array<COST_SENSITIVE::label>& prepped_cs_labels, uint64_t offset, size_t id = 0)
{
  cb_labels.clear();
  if (prepped_cs_labels.size() < cs_labels.costs.size() + 1)
  {
    prepped_cs_labels.resize(cs_labels.costs.size() + 1);
    prepped_cs_labels.end() = prepped_cs_labels.end_array;
  }

  // 1st: save cb_label (into mydata) and store cs_label for each example, which will be passed into base.learn.
  // also save offsets
  uint64_t saved_offset = examples[0]->ft_offset;
  size_t index = 0;
  for (auto ec : examples)
  {
    cb_labels.push_back(ec->l.cb);
    prepped_cs_labels[index].costs.clear();
    prepped_cs_labels[index].costs.push_back(cs_labels.costs[index]);
    ec->l.cs = prepped_cs_labels[index++];
    ec->ft_offset = offset;
  }

  // 2nd: predict for each ex
  // // call base.predict for all examples
  if (is_learn)
    base.learn(examples, (int32_t)id);
  else
    base.predict(examples, (int32_t)id);

  // 3rd: restore cb_label for each example
  // (**ec).l.cb = array.element.
  // and restore offsets
  for (size_t i = 0; i < examples.size(); ++i)
  {
    examples[i]->l.cb = cb_labels[i];
    examples[i]->ft_offset = saved_offset;
  }
}